

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.c
# Opt level: O0

int nn_port_resolve(char *port,size_t portlen)

{
  size_t local_30;
  size_t i;
  int res;
  size_t portlen_local;
  char *port_local;
  
  i._4_4_ = 0;
  local_30 = 0;
  while( true ) {
    if (local_30 == portlen) {
      if (i._4_4_ == 0) {
        port_local._4_4_ = -0x16;
      }
      else {
        port_local._4_4_ = i._4_4_;
      }
      return port_local._4_4_;
    }
    if ((port[local_30] < '0') || ('9' < port[local_30])) break;
    i._4_4_ = port[local_30] + -0x30 + i._4_4_ * 10;
    if (0xffff < i._4_4_) {
      return -0x16;
    }
    local_30 = local_30 + 1;
  }
  return -0x16;
}

Assistant:

int nn_port_resolve (const char *port, size_t portlen)
{
    int res;
    size_t i;

    res = 0;
    for (i = 0; i != portlen; ++i) {
        if (port [i] < '0' || port [i] > '9')
            return -EINVAL;
        res *= 10;
        res += port [i] - '0';
        if (res > 0xffff)
            return -EINVAL;
    }

    /*  Port 0 has special meaning (assign an ephemeral port to the socket),
        thus it is illegal to use it in the connection string. */
    if (res == 0)
        return -EINVAL;

    return res;
}